

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

bool __thiscall Common::check(Common *this,TaskHandle *head)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer psVar3;
  byte bVar4;
  int iVar5;
  shared_ptr<Operand> *operand;
  _Rb_tree_node_base *p_Var6;
  pointer pOVar7;
  size_type sVar8;
  pointer pOVar9;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  ulong uVar10;
  char *fmt;
  pointer __x;
  TaskHandle task;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pOVar9 = (pointer)(this->operands).
                    super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar7 = (pointer)(this->operands).
                         super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar9;
      pOVar7 = (pointer)&pOVar7->version) {
    peVar1 = (pOVar7->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->on_device = false;
    peVar1->occurred = false;
  }
  for (p_Var6 = (this->already_on)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->already_on)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    pOVar9 = *(pointer *)(p_Var6 + 1);
    *(undefined1 *)
     &(pOVar9->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 1;
  }
  local_28 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20._M_pi = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pOVar9 = (pointer)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  if (local_28 != (element_type *)0x0) {
    do {
      iVar5 = std::__cxx11::string::compare((char *)&local_28->name);
      if (iVar5 == 0) {
        pOVar9 = (local_28->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pOVar7 = (local_28->outs).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_start; pOVar7 != pOVar9; pOVar7 = pOVar7 + 1) {
          peVar1 = (pOVar7->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar1->on_device == false) {
            uVar10 = (ulong)(uint)peVar1->id;
            fmt = "Operand %d not on device (.dealloc)\n";
            goto LAB_0011ab69;
          }
          peVar1->on_device = false;
        }
      }
      else {
        pOVar9 = (local_28->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pOVar7 = (local_28->ins).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_start; pOVar7 != pOVar9; pOVar7 = pOVar7 + 1) {
          peVar1 = (pOVar7->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar1->on_device == false) {
            uVar10 = (ulong)(uint)peVar1->id;
            fmt = "Operand %d not on device (normal operators)\n";
            goto LAB_0011ab69;
          }
        }
        pOVar9 = (local_28->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pOVar7 = (local_28->outs).
                      super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                      super__Vector_impl_data._M_start; pOVar7 != pOVar9; pOVar7 = pOVar7 + 1) {
          ((pOVar7->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          on_device = true;
        }
      }
      peVar2 = (local_28->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_20,
                 &(local_28->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      local_28 = peVar2;
    } while (peVar2 != (element_type *)0x0);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  __x = (this->operands).
        super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->operands).
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__x != psVar3) {
    do {
      bVar4 = ((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device;
      if ((bool)bVar4 == true) {
        sVar8 = std::
                set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                ::count(&this->not_dealloc,__x);
        pOVar9 = (pointer)(__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (sVar8 == 0) goto LAB_0011ab70;
        bVar4 = *(byte *)&(pOVar9->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
      }
      if ((bVar4 & 1) == 0) {
        sVar8 = std::
                set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                ::count(&this->not_dealloc,__x);
        if (sVar8 != 0) {
          uVar10 = (ulong)(uint)((__x->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->id;
          fmt = "Operand %d has been dealloc but should not\n";
LAB_0011ab69:
          do {
            error(fmt,uVar10);
LAB_0011ab70:
            uVar10 = (ulong)*(uint *)&(pOVar9->operand).
                                      super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi;
            fmt = "Forget to dealloc %d\n";
          } while( true );
        }
      }
      __x = __x + 1;
    } while (__x != psVar3);
  }
  return true;
}

Assistant:

bool check(TaskHandle &head) const {
        // Clear status
        for (auto &operand: operands) {
            operand->clear();
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
        }

        // Simulate and check
        LOOP(task, head) {
            if (task->isDealloc()) {
                for (auto &usage: task->outs) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (.dealloc)\n", usage.operand->id);
                        return false;
                    }
                    usage.operand->on_device = false;
                }
            } else {
                for (auto &usage: task->ins) {
                    if (not usage.operand->on_device) {
                        error("Operand %d not on device (normal operators)\n", usage.operand->id);
                        return false;
                    }
                }
                for (auto &usage: task->outs) {
                    usage.operand->on_device = true;
                }
            }
        }

        // Check final status
        for (auto &operand: operands) {
            if (operand->on_device and not not_dealloc.count(operand)) {
                error("Forget to dealloc %d\n", operand->id);
                return false;
            }
            if (not operand->on_device and not_dealloc.count(operand)) {
                error("Operand %d has been dealloc but should not\n", operand->id);
                return false;
            }
        }
        return true;
    }